

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb.cc
# Opt level: O2

size_t CB_EVAL::read_cached_label(shared_data *sd,void *v,io_buf *cache)

{
  char *in_RAX;
  size_t sVar1;
  shared_data *psVar2;
  char *c;
  
  psVar2 = (shared_data *)cache;
  c = in_RAX;
  sVar1 = io_buf::buf_read(cache,&c,4);
  if (sVar1 < 4) {
    sVar1 = 0;
  }
  else {
    *(undefined4 *)v = *(undefined4 *)c;
    sVar1 = CB::read_cached_label(psVar2,(void *)((long)v + 8),cache);
    sVar1 = sVar1 + 4;
  }
  return sVar1;
}

Assistant:

size_t read_cached_label(shared_data* sd, void* v, io_buf& cache)
{
  CB_EVAL::label* ld = (CB_EVAL::label*)v;
  char* c;
  size_t total = sizeof(uint32_t);
  if (cache.buf_read(c, total) < total)
    return 0;
  ld->action = *(uint32_t*)c;

  return total + CB::read_cached_label(sd, &(ld->event), cache);
}